

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CodeGeneratorTest_GetResolvedSourceFeatureExtensionDefaultsFromFeatureSetExtension_Test::
~CodeGeneratorTest_GetResolvedSourceFeatureExtensionDefaultsFromFeatureSetExtension_Test
          (CodeGeneratorTest_GetResolvedSourceFeatureExtensionDefaultsFromFeatureSetExtension_Test
           *this)

{
  CodeGeneratorTest_GetResolvedSourceFeatureExtensionDefaultsFromFeatureSetExtension_Test
  *this_local;
  
  ~CodeGeneratorTest_GetResolvedSourceFeatureExtensionDefaultsFromFeatureSetExtension_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(CodeGeneratorTest,
       GetResolvedSourceFeatureExtensionDefaultsFromFeatureSetExtension) {
  // Make sure feature set defaults are empty in the pool.
  TestGenerator generator;
  generator.set_feature_extensions({});
  ASSERT_OK(pool_.SetFeatureSetDefaults(*generator.BuildFeatureSetDefaults()));

  ASSERT_THAT(BuildFile(DescriptorProto::descriptor()->file()), NotNull());
  ASSERT_THAT(BuildFile(pb::TestMessage::descriptor()->file()), NotNull());
  auto file = BuildFile(R"schema(
    edition = "2023";
    package proto2_unittest;

    import "google/protobuf/unittest_features.proto";

    option features.(pb.test).file_feature = VALUE6;
    option features.(pb.test).source_feature = VALUE5;
  )schema");
  ASSERT_THAT(file, NotNull());

  const pb::TestFeatures& ext1 =
      TestGenerator::GetResolvedSourceFeatureExtension(*file, pb::test);
  const pb::TestFeatures& ext2 =
      TestGenerator::GetResolvedSourceFeatures(*file).GetExtension(pb::test);

  // No defaults were added to the pool, but they should be still present in the
  // result. On the other hand, features that are explicitly set should be also
  // present.
  EXPECT_EQ(ext1.enum_feature(), pb::EnumFeature::VALUE1);
  EXPECT_EQ(ext1.field_feature(), pb::EnumFeature::VALUE1);
  EXPECT_EQ(ext1.file_feature(), pb::EnumFeature::VALUE6);
  EXPECT_EQ(ext1.source_feature(), pb::EnumFeature::VALUE5);
  EXPECT_EQ(ext2.enum_feature(), pb::EnumFeature::TEST_ENUM_FEATURE_UNKNOWN);
  EXPECT_EQ(ext2.field_feature(), pb::EnumFeature::TEST_ENUM_FEATURE_UNKNOWN);
  EXPECT_EQ(ext2.file_feature(), pb::EnumFeature::VALUE6);
  EXPECT_EQ(ext2.source_feature(), pb::EnumFeature::VALUE5);
}